

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ExternalInstanceRef *name)

{
  size_type sVar1;
  GlobalName local_40;
  GlobalName local_30;
  undefined1 local_19;
  ExternalInstanceRef *pEStack_18;
  bool is_import;
  ExternalInstanceRef *name_local;
  CWriter *this_local;
  
  pEStack_18 = name;
  name_local = (ExternalInstanceRef *)this;
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->import_syms_,(name->super_GlobalName).name);
  local_19 = sVar1 != 0;
  if ((bool)local_19) {
    local_30.type = (pEStack_18->super_GlobalName).type;
    local_30._4_4_ = *(undefined4 *)&(pEStack_18->super_GlobalName).field_0x4;
    local_30.name = (pEStack_18->super_GlobalName).name;
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[13],wabt::(anonymous_namespace)::GlobalName,char_const(&)[2]>
              ((CWriter *)this,(char (*) [13])"(*instance->",&local_30,(char (*) [2])0x21dbf2);
  }
  else {
    local_40.type = (pEStack_18->super_GlobalName).type;
    local_40._4_4_ = *(undefined4 *)&(pEStack_18->super_GlobalName).field_0x4;
    local_40.name = (pEStack_18->super_GlobalName).name;
    (anonymous_namespace)::CWriter::Write<char_const(&)[11],wabt::(anonymous_namespace)::GlobalName>
              ((CWriter *)this,(char (*) [11])0x2220e1,&local_40);
  }
  return;
}

Assistant:

void CWriter::Write(const ExternalInstanceRef& name) {
  bool is_import = import_syms_.count(name.name) != 0;
  if (is_import) {
    Write("(*instance->", GlobalName(name), ")");
  } else {
    Write("instance->", GlobalName(name));
  }
}